

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O1

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
KmerCounter::get_count_by_name(KmerCounter *this,string *name)

{
  long lVar1;
  pointer pbVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__s2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_RAX;
  undefined4 extraout_var;
  runtime_error *this_00;
  long lVar5;
  ulong uVar6;
  size_type *psVar7;
  ulong uVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar2 = (this->count_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->count_names).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  bVar9 = lVar5 != 0;
  if (bVar9) {
    uVar6 = lVar5 >> 5;
    __s2 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(name->_M_dataplus)._M_p;
    sVar3 = name->_M_string_length;
    lVar5 = 0;
    psVar7 = &pbVar2->_M_string_length;
    uVar8 = 1;
    in_RAX = __s2;
    do {
      __n = *psVar7;
      if (__n == sVar3) {
        if (__n != 0) {
          iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (psVar7 + -1))->_M_dataplus)._M_p,__s2,__n);
          in_RAX = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   CONCAT44(extraout_var,iVar4);
          if (iVar4 != 0) goto LAB_0019b870;
        }
        in_RAX = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 ((long)(this->counts).
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - lVar5);
        break;
      }
LAB_0019b870:
      bVar9 = uVar8 < uVar6;
      lVar5 = lVar5 + -0x18;
      psVar7 = psVar7 + 4;
      lVar1 = (-(ulong)(uVar6 == 0) - uVar6) + uVar8;
      uVar8 = uVar8 + 1;
    } while (lVar1 != 0);
  }
  if (!bVar9) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Couldn\'t find a count named: ",name);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return in_RAX;
}

Assistant:

const std::vector<uint16_t> &KmerCounter::get_count_by_name(const std::string &name) const {
    for (int i = 0; i < count_names.size(); i++) {
        if (count_names[i] == name) {
            return counts[i];
        }
    }

    throw std::runtime_error("Couldn't find a count named: "+name);
}